

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psemaphore-posix.c
# Opt level: O3

void pp_semaphore_clean_handle(PSemaphore *sem)

{
  int iVar1;
  
  if ((sem_t *)sem->sem_hdl != (sem_t *)0x0) {
    iVar1 = sem_close((sem_t *)sem->sem_hdl);
    if (iVar1 == -1) {
      printf("** Error: %s **\n","PSemaphore::pp_semaphore_clean_handle: sem_close() failed");
    }
    if ((sem->sem_hdl != (psem_hdl *)0x0) && (sem->sem_created == 1)) {
      iVar1 = sem_unlink(sem->platform_key);
      if (iVar1 == -1) {
        printf("** Error: %s **\n","PSemaphore::pp_semaphore_clean_handle: sem_unlink() failed");
      }
    }
  }
  sem->sem_created = 0;
  sem->sem_hdl = (psem_hdl *)0x0;
  return;
}

Assistant:

static void
pp_semaphore_clean_handle (PSemaphore *sem)
{
	if (P_UNLIKELY (sem->sem_hdl != P_SEM_INVALID_HDL &&
			sem_close (sem->sem_hdl) == -1))
		P_ERROR ("PSemaphore::pp_semaphore_clean_handle: sem_close() failed");

	if (sem->sem_hdl != P_SEM_INVALID_HDL &&
	    sem->sem_created == TRUE &&
	    sem_unlink (sem->platform_key) == -1)
		P_ERROR ("PSemaphore::pp_semaphore_clean_handle: sem_unlink() failed");

	sem->sem_created = FALSE;
	sem->sem_hdl = P_SEM_INVALID_HDL;
}